

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ComputeConsistentMassMatrix
          (ChElementBeamTaperedTimoshenkoFPM *this)

{
  ChMatrixDynamic<> *this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ChElementBeamTaperedTimoshenko *pCVar13;
  ulong uVar14;
  ActualDstType actualDst;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  BeamTaperedTimoshenkoFPM myformula;
  ChMatrixNM<double,_12,_12> TempMassMatrix;
  ChIntegrable1D<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> local_518;
  ChElementBeamTaperedTimoshenkoFPM *local_510;
  undefined4 local_508;
  undefined1 local_500 [72];
  double adStack_4b8 [4];
  double adStack_498 [3];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar15 = local_500._0_64_;
  pCVar13 = &this->super_ChElementBeamTaperedTimoshenko;
  uVar11 = (pCVar13->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  uVar12 = (pCVar13->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols;
  local_500._8_8_ = uVar12;
  local_500._0_8_ = uVar11;
  local_500._24_40_ = auVar15._24_40_;
  local_500._16_8_ = 0;
  if (((this->super_ChElementBeamTaperedTimoshenko).M.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols |
      (pCVar13->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      ) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  this_00 = &(this->super_ChElementBeamTaperedTimoshenko).M;
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (this_00,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)local_500,(assign_op<double,_double> *)&local_518);
  local_518._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_00b5a8e8;
  local_508 = 2;
  local_510 = this;
  memset((Matrix<double,_12,_12,_1,_12,_12> *)local_500,0,0x480);
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,12,1,12,12>>
            ((Matrix<double,_12,_12,_1,_12,_12> *)local_500,&local_518,-1.0,1.0,this->guass_order);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.length * 0.5;
  auVar15 = vbroadcastsd_avx512f(auVar16);
  local_500._0_64_ = vmulpd_avx512f(auVar15,local_500._0_64_);
  register0x000008fc = vmulpd_avx512f(auVar15,stack0xfffffffffffffb40);
  local_480 = vmulpd_avx512f(auVar15,local_480);
  local_440 = vmulpd_avx512f(auVar15,local_440);
  local_400 = vmulpd_avx512f(auVar15,local_400);
  local_3c0 = vmulpd_avx512f(auVar15,local_3c0);
  local_380 = vmulpd_avx512f(auVar15,local_380);
  local_340 = vmulpd_avx512f(auVar15,local_340);
  local_300 = vmulpd_avx512f(auVar15,local_300);
  local_2c0 = vmulpd_avx512f(auVar15,local_2c0);
  local_280 = vmulpd_avx512f(auVar15,local_280);
  local_240 = vmulpd_avx512f(auVar15,local_240);
  local_200 = vmulpd_avx512f(auVar15,local_200);
  local_1c0 = vmulpd_avx512f(auVar15,local_1c0);
  local_180 = vmulpd_avx512f(auVar15,local_180);
  local_140 = vmulpd_avx512f(auVar15,local_140);
  local_100 = vmulpd_avx512f(auVar15,local_100);
  local_c0 = vmulpd_avx512f(auVar15,local_c0);
  if (((this->super_ChElementBeamTaperedTimoshenko).M.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows != 0xc) ||
     ((this->super_ChElementBeamTaperedTimoshenko).M.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols != 0xc)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)this_00,0x90,0xc,0xc);
  }
  if (((this->super_ChElementBeamTaperedTimoshenko).M.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows == 0xc) &&
     ((this->super_ChElementBeamTaperedTimoshenko).M.
      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols == 0xc)) {
    pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    uVar14 = 0xfffffffffffffff8;
    do {
      lVar1 = uVar14 * 8;
      dVar4 = adStack_4b8[uVar14];
      dVar5 = adStack_4b8[uVar14 + 1];
      dVar6 = adStack_4b8[uVar14 + 2];
      dVar7 = adStack_4b8[uVar14 + 3];
      dVar8 = *(double *)(local_480 + lVar1 + -0x18);
      dVar9 = *(double *)(local_480 + lVar1 + -0x10);
      dVar10 = *(double *)(local_480 + lVar1 + -8);
      pdVar2 = pdVar3 + uVar14 + 8;
      *pdVar2 = adStack_4b8[uVar14 - 1];
      pdVar2[1] = dVar4;
      pdVar2[2] = dVar5;
      pdVar2[3] = dVar6;
      pdVar2[4] = dVar7;
      pdVar2[5] = dVar8;
      pdVar2[6] = dVar9;
      pdVar2[7] = dVar10;
      uVar14 = uVar14 + 8;
    } while (uVar14 < 0x88);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 12, 12, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::ComputeConsistentMassMatrix() {
    // Calculate the local element mass matrix via Guass integration
    this->M.setZero();
    BeamTaperedTimoshenkoFPM myformula(this, 2);  // 2: mass matrix
    ChMatrixNM<double, 12, 12> TempMassMatrix;
    TempMassMatrix.setZero();
    ChQuadrature::Integrate1D<ChMatrixNM<double, 12, 12>>(TempMassMatrix,  // result of integration will go there
                                                          myformula,       // formula to integrate
                                                          -1, 1,           // x limits
                                                          guass_order      // order of integration
    );
    // eta = 2*x/L;
    // ---> Deta/dx = 2./L;
    // ---> detJ = dx/Deta = L/2.;
    TempMassMatrix *= this->length / 2.0;  // need to multiple detJ
    this->M = TempMassMatrix;
    // If the cross-sectional mass properties are given at the mass center,
    // then it should be transformed to the centerline firstly,
    // this is handled in the Class ChBeamSectionTimoshenkoAdvancedGenericFPM. NOT HERE.
}